

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::~Tables(Tables *this)

{
  pointer ppVar1;
  pointer ppcVar2;
  pointer pCVar3;
  
  ppVar1 = (this->extensions_after_checkpoint_).
           super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1);
  }
  ppcVar2 = (this->files_after_checkpoint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2);
  }
  ppcVar2 = (this->symbols_after_checkpoint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2);
  }
  pCVar3 = (this->checkpoints_).
           super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3);
  }
  std::
  _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::~_Rb_tree(&(this->extensions_)._M_t);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->files_by_name_)._M_h);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->symbols_by_name_)._M_h);
  std::
  vector<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
  ::~vector(&this->file_tables_);
  std::
  vector<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>,_std::allocator<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>_>_>
  ::~vector(&this->once_dynamics_);
  std::
  vector<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  ::~vector(&this->messages_);
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->strings_);
  std::
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ::~vector(&this->allocations_);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->extensions_loaded_from_db_)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->known_bad_symbols_)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->known_bad_files_)._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->pending_files_);
  return;
}

Assistant:

DescriptorPool::Tables::~Tables() {
  GOOGLE_DCHECK(checkpoints_.empty());
}